

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
glcts::(anonymous_namespace)::BasicAllTargetsStoreFS::Write<tcu::Vector<float,4>>
          (BasicAllTargetsStoreFS *this,int target,GLenum internalformat,
          Vector<float,_4> *write_value,Vector<float,_4> *expected_value)

{
  allocator<tcu::Vector<float,_4>_> *paVar1;
  byte bVar2;
  uint uVar3;
  GLuint GVar4;
  GLint GVar5;
  char *src_fs;
  reference pvVar6;
  undefined8 uVar7;
  string local_1a0;
  int local_17c;
  Vector<float,_4> *pVStack_178;
  int layers;
  Vector<float,_4> *map_data;
  GLuint local_168;
  GLuint GStack_164;
  bool status;
  GLuint m_buffer [4];
  allocator<tcu::Vector<float,_4>_> local_149;
  undefined1 local_148 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> out_data2DArray;
  undefined1 local_128 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> out_dataCube;
  undefined1 local_108 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> out_data3D;
  undefined1 local_e8 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> out_data2D;
  allocator<tcu::Vector<float,_4>_> local_a9;
  GLuint c_program;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  GLuint local_88;
  int kSize;
  GLuint textures [8];
  string local_58;
  GLuint local_34;
  char *pcStack_30;
  GLuint program;
  char *src_vs;
  Vector<float,_4> *expected_value_local;
  Vector<float,_4> *write_value_local;
  GLenum internalformat_local;
  int target_local;
  BasicAllTargetsStoreFS *this_local;
  
  pcStack_30 = 
  "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}";
  src_vs = (char *)expected_value;
  expected_value_local = write_value;
  write_value_local._0_4_ = internalformat;
  write_value_local._4_4_ = target;
  _internalformat_local = this;
  GenFS<tcu::Vector<float,4>>(&local_58,this,target,internalformat,write_value);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar4 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                    ((ShaderImageLoadStoreBase *)this,
                     "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,src_fs,false,false);
  std::__cxx11::string::~string((string *)&local_58);
  local_34 = GVar4;
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),8,&local_88);
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0xb;
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_a9);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&c_program,
             0xf2,&local_a9);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_a9);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,kSize);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D
            ((CallLogWrapper *)(this + 8),0xde1,1,(GLenum)write_value_local,0xb,0xb);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x806f,textures[0]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x806f,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x806f,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage3D
            ((CallLogWrapper *)(this + 8),0x806f,1,(GLenum)write_value_local,0xb,0xb,2);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x806f,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8513,textures[2]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8513,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8513,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D
            ((CallLogWrapper *)(this + 8),0x8513,1,(GLenum)write_value_local,0xb,0xb);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8513,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,textures[5]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage3D
            ((CallLogWrapper *)(this + 8),0x8c1a,1,(GLenum)write_value_local,0xb,0xb,2);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,0);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),0,kSize,0,'\0',0,0x88b9,(GLenum)write_value_local);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),1,textures[0],0,'\x01',0,0x88b9,(GLenum)write_value_local)
  ;
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),2,textures[2],0,'\x01',0,0x88b9,(GLenum)write_value_local)
  ;
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),3,textures[5],0,'\x01',0,0x88b9,(GLenum)write_value_local)
  ;
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_34);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glViewport((CallLogWrapper *)(this + 8),0,0,0xb,0xb);
  glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),5,0,4);
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)(this + 8),0x84c1);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,kSize);
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)(this + 8),0x84c2);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x806f,textures[0]);
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)(this + 8),0x84c3);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8513,textures[2]);
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)(this + 8),0x84c4);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,textures[5]);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),8);
  GenC<tcu::Vector<float,4>>
            ((string *)
             &out_data2D.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,this,expected_value_local);
  GVar4 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                    ((ShaderImageLoadStoreBase *)this,
                     (string *)
                     &out_data2D.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
  std::__cxx11::string::~string
            ((string *)
             &out_data2D.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  paVar1 = (allocator<tcu::Vector<float,_4>_> *)
           ((long)&out_data3D.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_e8,
             0x2d6,paVar1);
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)
             ((long)&out_data3D.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<tcu::Vector<float,_4>_> *)
           ((long)&out_dataCube.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_108,
             0x2d6,paVar1);
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)
             ((long)&out_dataCube.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<tcu::Vector<float,_4>_> *)
           ((long)&out_data2DArray.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_128,
             0x2d6,paVar1);
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)
             ((long)&out_data2DArray.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_149);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_148,
             0x2d6,&local_149);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_149);
  glu::CallLogWrapper::glGenBuffers((CallLogWrapper *)(this + 8),4,&local_168);
  glu::CallLogWrapper::glBindBufferBase((CallLogWrapper *)(this + 8),0x90d2,1,local_168);
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_128,0);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)(this + 8),0x90d2,0x2d60,pvVar6,0x88e4);
  glu::CallLogWrapper::glBindBufferBase((CallLogWrapper *)(this + 8),0x90d2,0,GStack_164);
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_128,0);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)(this + 8),0x90d2,0x2d60,pvVar6,0x88e4);
  glu::CallLogWrapper::glBindBufferBase((CallLogWrapper *)(this + 8),0x90d2,3,m_buffer[0]);
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_128,0);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)(this + 8),0x90d2,0x2d60,pvVar6,0x88e4);
  glu::CallLogWrapper::glBindBufferBase((CallLogWrapper *)(this + 8),0x90d2,2,m_buffer[1]);
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_128,0);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)(this + 8),0x90d2,0x2d60,pvVar6,0x88e4);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),GVar4);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),GVar4,"g_sampler_2d");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar5,1);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),GVar4,"g_sampler_3d");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar5,2);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),GVar4,"g_sampler_cube");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar5,3);
  GVar5 = glu::CallLogWrapper::glGetUniformLocation
                    ((CallLogWrapper *)(this + 8),GVar4,"g_sampler_2darray");
  glu::CallLogWrapper::glUniform1i((CallLogWrapper *)(this + 8),GVar5,4);
  glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)(this + 8),1,1,1);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x200);
  map_data._7_1_ = 1;
  glu::CallLogWrapper::glBindBuffer
            ((CallLogWrapper *)(this + 8),0x90d2,(&local_168)[(int)write_value_local._4_4_]);
  pVStack_178 = (Vector<float,_4> *)
                glu::CallLogWrapper::glMapBufferRange
                          ((CallLogWrapper *)(this + 8),0x90d2,0,0x2d60,1);
  local_17c = 2;
  if (write_value_local._4_4_ == 0) {
    local_17c = 1;
  }
  if (write_value_local._4_4_ == 2) {
    local_17c = 6;
  }
  map_data._7_1_ =
       ShaderImageLoadStoreBase::CompareValues<tcu::Vector<float,4>>
                 ((ShaderImageLoadStoreBase *)this,pVStack_178,0xb,(Vector<float,_4> *)src_vs,
                  (GLenum)write_value_local,local_17c);
  uVar3 = write_value_local._4_4_;
  if (!(bool)map_data._7_1_) {
    ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_1a0,(ShaderImageLoadStoreBase *)this,(GLenum)write_value_local);
    uVar7 = std::__cxx11::string::c_str();
    glcts::anon_unknown_0::Output("%d target, %s format failed. \n",(ulong)uVar3,uVar7);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  glu::CallLogWrapper::glUnmapBuffer((CallLogWrapper *)(this + 8),0x90d2);
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),8,&local_88);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
  glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_34);
  glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),GVar4);
  glu::CallLogWrapper::glDeleteBuffers((CallLogWrapper *)(this + 8),4,&local_168);
  bVar2 = map_data._7_1_;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_148);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_128);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_108);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_e8);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&c_program);
  return (bool)(bVar2 & 1);
}

Assistant:

bool Write(int target, GLenum internalformat, const T& write_value, const T& expected_value)
	{
		const char* src_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL "  gl_Position = i_position;" NL "}";
		const GLuint program = BuildProgram(src_vs, GenFS(target, internalformat, write_value).c_str());
		GLuint		 textures[8];
		glGenTextures(8, textures);

		const int	  kSize = 11;
		std::vector<T> data(kSize * kSize * 2);

		glBindTexture(GL_TEXTURE_2D, textures[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindTexture(GL_TEXTURE_3D, textures[2]);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage3D(GL_TEXTURE_3D, 1, internalformat, kSize, kSize, 2);
		glBindTexture(GL_TEXTURE_3D, 0);

		glBindTexture(GL_TEXTURE_CUBE_MAP, textures[4]);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_CUBE_MAP, 1, internalformat, kSize, kSize);
		glBindTexture(GL_TEXTURE_CUBE_MAP, 0);

		glBindTexture(GL_TEXTURE_2D_ARRAY, textures[7]);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage3D(GL_TEXTURE_2D_ARRAY, 1, internalformat, kSize, kSize, 2);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		glBindImageTexture(0, textures[1], 0, GL_FALSE, 0, GL_WRITE_ONLY, internalformat); // 2D
		glBindImageTexture(1, textures[2], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);  // 3D
		glBindImageTexture(2, textures[4], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);  // Cube
		glBindImageTexture(3, textures[7], 0, GL_TRUE, 0, GL_WRITE_ONLY, internalformat);  // 2DArray

		glUseProgram(program);
		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, kSize);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glActiveTexture(GL_TEXTURE1);
		glBindTexture(GL_TEXTURE_2D, textures[1]);
		glActiveTexture(GL_TEXTURE2);
		glBindTexture(GL_TEXTURE_3D, textures[2]);
		glActiveTexture(GL_TEXTURE3);
		glBindTexture(GL_TEXTURE_CUBE_MAP, textures[4]);
		glActiveTexture(GL_TEXTURE4);
		glBindTexture(GL_TEXTURE_2D_ARRAY, textures[7]);
		glMemoryBarrier(GL_TEXTURE_FETCH_BARRIER_BIT);

		GLuint		   c_program = CreateComputeProgram(GenC(write_value));
		std::vector<T> out_data2D(kSize * kSize * 6);
		std::vector<T> out_data3D(kSize * kSize * 6);
		std::vector<T> out_dataCube(kSize * kSize * 6);
		std::vector<T> out_data2DArray(kSize * kSize * 6);
		GLuint		   m_buffer[4];
		glGenBuffers(4, m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[0]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 6 * kSize * kSize * 4 * 4, &out_dataCube[0], GL_STATIC_DRAW);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[1]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 6 * kSize * kSize * 4 * 4, &out_dataCube[0], GL_STATIC_DRAW);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_buffer[2]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 6 * kSize * kSize * 4 * 4, &out_dataCube[0], GL_STATIC_DRAW);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_buffer[3]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 6 * kSize * kSize * 4 * 4, &out_dataCube[0], GL_STATIC_DRAW);

		glUseProgram(c_program);
		glUniform1i(glGetUniformLocation(c_program, "g_sampler_2d"), 1);
		glUniform1i(glGetUniformLocation(c_program, "g_sampler_3d"), 2);
		glUniform1i(glGetUniformLocation(c_program, "g_sampler_cube"), 3);
		glUniform1i(glGetUniformLocation(c_program, "g_sampler_2darray"), 4);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool status = true;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[target]);
		T*  map_data = (T*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 6 * kSize * kSize * 4 * 4, GL_MAP_READ_BIT);
		int layers   = 2;
		if (target == T2D)
			layers = 1;
		if (target == TCM)
			layers = 6;
		status	 = CompareValues(map_data, kSize, expected_value, internalformat, layers);
		if (!status)
			Output("%d target, %s format failed. \n", target, FormatEnumToString(internalformat).c_str());
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		glDeleteTextures(8, textures);
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteProgram(c_program);
		glDeleteBuffers(4, m_buffer);

		return status;
	}